

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbaselib.cpp
# Opt level: O0

SQInteger array_top(HSQUIRRELVM v)

{
  SQInteger SVar1;
  SQVM *in_RDI;
  SQObject *o;
  SQObjectPtr *in_stack_ffffffffffffffd8;
  HSQUIRRELVM in_stack_ffffffffffffffe0;
  undefined8 local_8;
  
  stack_get(in_stack_ffffffffffffffe0,(SQInteger)in_stack_ffffffffffffffd8);
  SVar1 = SQArray::Size((SQArray *)0x11dedb);
  if (SVar1 < 1) {
    local_8 = sq_throwerror(in_stack_ffffffffffffffe0,(SQChar *)in_stack_ffffffffffffffd8);
  }
  else {
    SQArray::Top((SQArray *)0x11def9);
    SQVM::Push(in_RDI,in_stack_ffffffffffffffd8);
    local_8 = 1;
  }
  return local_8;
}

Assistant:

static SQInteger array_top(HSQUIRRELVM v)
{
    SQObject &o=stack_get(v,1);
    if(_array(o)->Size()>0){
        v->Push(_array(o)->Top());
        return 1;
    }
    else return sq_throwerror(v,_SC("top() on a empty array"));
}